

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

void addJsonArray(QJsonArray *array,QString *keyPrefix,ProValueMap *map)

{
  int iVar1;
  qsizetype qVar2;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  int size;
  QString number;
  QStringList keys;
  QStringBuilder<const_QString_&,_QLatin1String> *in_stack_fffffffffffffef8;
  QList<QString> *in_stack_ffffffffffffff00;
  QLatin1String *in_stack_ffffffffffffff10;
  ProValueMap *map_00;
  QStringList *values;
  undefined4 in_stack_ffffffffffffff28;
  int iVar3;
  QJsonValue *in_stack_ffffffffffffff48;
  ProValueMap local_a8 [2];
  qsizetype in_stack_ffffffffffffff68;
  QStringList local_90;
  QStringBuilder<const_QString_&,_const_QString_&> local_78;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  QString local_38;
  QJsonValue local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_38.d.size = -0x5555555555555556;
  QList<QString>::QList((QList<QString> *)0x2c6d11);
  qVar2 = QJsonArray::count((QJsonArray *)0x2c6d1b);
  iVar1 = (int)qVar2;
  QList<QString>::reserve
            ((QList<QString> *)CONCAT44(iVar1,in_stack_ffffffffffffff28),in_stack_ffffffffffffff68);
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    QString::number((int)&local_50,iVar3);
    QList<QString>::append(in_stack_ffffffffffffff00,(parameter_type)in_stack_fffffffffffffef8);
    QJsonArray::at((longlong)local_20);
    local_78 = operator+((QString *)in_stack_ffffffffffffff00,(QString *)in_stack_fffffffffffffef8);
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QString_&,_const_QString_&> *)in_stack_fffffffffffffef8);
    addJsonValue(in_stack_ffffffffffffff48,in_RDI,(ProValueMap *)in_RSI);
    QString::~QString((QString *)0x2c6e14);
    QJsonValue::~QJsonValue(local_20);
    QString::~QString((QString *)0x2c6e2e);
  }
  QLatin1String::QLatin1String(in_stack_ffffffffffffff10,&stack0xffffffffffffff48);
  map_00 = local_a8;
  operator+(in_RSI,(QLatin1String *)in_stack_fffffffffffffef8);
  values = &local_90;
  QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffef8);
  insertJsonKeyValue(&local_38,values,map_00);
  QString::~QString((QString *)0x2c6eb1);
  QList<QString>::~QList((QList<QString> *)0x2c6ebb);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addJsonArray(const QJsonArray &array, const QString &keyPrefix, ProValueMap *map)
{
    QStringList keys;
    const int size = array.count();
    keys.reserve(size);
    for (int i = 0; i < size; ++i) {
        const QString number = QString::number(i);
        keys.append(number);
        addJsonValue(array.at(i), keyPrefix + number, map);
    }
    insertJsonKeyValue(keyPrefix + QLatin1String("_KEYS_"), keys, map);
}